

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_benchmark.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_c1df::read_modern_inc
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          char *file_name)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vec;
  dynamic_vector_buffer<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  undefined1 local_55;
  path local_48;
  file local_20;
  file file;
  char *file_name_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *output;
  
  file.fd_ = (file_descriptor_handle)file_name;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_48,(char **)&file,auto_format);
  io::open_file((io *)&local_20,&local_48,read_only,owner_read|owner_write);
  std::filesystem::__cxx11::path::~path(&local_48);
  local_55 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  io::net::dynamic_buffer<unsigned_char,std::allocator<unsigned_char>>
            (&local_70,(net *)__return_storage_ptr__,vec);
  io::
  read_all<io::posix::file,io::net::dynamic_vector_buffer<unsigned_char,std::allocator<unsigned_char>>,void>
            (&local_20,&local_70);
  local_55 = 1;
  io::posix::file::~file(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::uint8_t> read_modern_inc(const char* file_name)
{
    auto file = io::open_file(file_name, io::open_mode::read_only);
    std::vector<uint8_t> output;
    io::read_all(file, io::dynamic_buffer(output));
    return output;
}